

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<kj::AsyncCapabilityStream::ReadResult> __thiscall
kj::anon_unknown_0::AsyncStreamFd::tryReadInternal
          (AsyncStreamFd *this,void *buffer,size_t minBytes,size_t maxBytes,OwnFd *fdBuffer,
          size_t maxFds,ReadResult alreadyRead)

{
  PromiseArena *pPVar1;
  ReadResult alreadyRead_00;
  PromiseBase PVar2;
  undefined1 auVar3 [8];
  Exception *pEVar4;
  Exception *pEVar5;
  AncillaryMessage *pAVar6;
  RemoveConst<kj::AncillaryMessage> *pRVar7;
  AncillaryMessage *pAVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  char *pcVar12;
  SourceLocation *pSVar13;
  void *buffer_00;
  TransformPromiseNodeBase *this_00;
  int iVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  char *pcVar18;
  bool bVar19;
  ArrayDisposer *in_stack_00000018;
  OwnFd ownFd;
  Fault f_1;
  Vector<kj::AncillaryMessage> ancillaryMessages;
  Array<void_*> cmsgSpace_heap;
  Fault f;
  iovec iov;
  void *cmsgSpace_stack [16];
  OwnFd local_1a4;
  void *local_1a0;
  PromiseBase local_198;
  Detail *local_190;
  undefined1 local_188 [8];
  Exception *pEStack_180;
  Exception *local_178;
  ArrayDisposer *local_170;
  RemoveConst<kj::Exception::Detail> *local_160;
  Vector<kj::AncillaryMessage> local_158;
  SourceLocation *local_138;
  ulong uStack_130;
  undefined8 *local_128;
  void *local_120;
  void *local_118;
  OwnFd local_10c;
  msghdr local_108;
  OwnFd *local_d0;
  iovec local_c8;
  SourceLocation local_b8 [5];
  
  local_160 = (RemoveConst<kj::Exception::Detail> *)alreadyRead.byteCount;
  local_198.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  local_1a0 = buffer;
  local_190 = (Detail *)maxFds;
  local_120 = (void *)maxBytes;
  if ((alreadyRead.byteCount == 0) && ((*(byte *)((long)buffer + 0x90) & 1) == 0)) {
    iVar14 = 0;
    do {
      pvVar11 = (void *)read(*(int *)((long)local_1a0 + 0x10),(void *)minBytes,(size_t)fdBuffer);
      if (-1 < (long)pvVar11) {
        iVar9 = 0;
        break;
      }
      iVar9 = kj::_::Debug::getOsErrorNumber(true);
    } while (iVar9 == -1);
    if (iVar9 != 0) {
      local_108.msg_name = (void *)0x0;
      local_b8[0].fileName = (char *)0x0;
      local_b8[0].function = (char *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_108,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::~Fault((Fault *)&local_108);
      iVar14 = 5;
    }
    if (iVar14 == 0) {
      local_160 = (RemoveConst<kj::Exception::Detail> *)0x0;
      buffer_00 = local_1a0;
LAB_004b447b:
      PVar2.node.ptr = local_198.node.ptr;
      if ((long)pvVar11 < 0) {
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_188);
        auVar3 = local_188;
        pPVar1 = (PromiseArena *)(((String *)local_188)->content).size_;
        if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_188 - (long)pPVar1) < 0x60) {
          pvVar11 = operator_new(0x400);
          this_00 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3a0);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_00,(OwnPromiseNode *)local_188,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:720:11)>
                     ::anon_class_64_7_61fcc940_for_func::operator());
          *(undefined ***)((long)pvVar11 + 0x3a0) = &PTR_destroy_0070dd50;
          *(void **)((long)pvVar11 + 0x3c0) = local_1a0;
          *(size_t *)((long)pvVar11 + 0x3c8) = minBytes;
          *(void **)((long)pvVar11 + 0x3d0) = local_120;
          *(OwnFd **)((long)pvVar11 + 0x3d8) = fdBuffer;
          *(Detail **)((long)pvVar11 + 0x3e0) = local_190;
          *(RemoveConst<kj::Exception::Detail> **)((long)pvVar11 + 1000) = local_160;
          *(size_t *)((long)pvVar11 + 0x3f0) = alreadyRead.capCount;
          *(ArrayDisposer **)((long)pvVar11 + 0x3f8) = in_stack_00000018;
          *(void **)((long)pvVar11 + 0x3a8) = pvVar11;
        }
        else {
          (((String *)local_188)->content).size_ = 0;
          this_00 = (TransformPromiseNodeBase *)
                    (((Exception *)((long)local_188 + -400))->trace + 0x19);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_00,(OwnPromiseNode *)local_188,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:720:11)>
                     ::anon_class_64_7_61fcc940_for_func::operator());
          ((Exception *)((long)auVar3 + -400))->trace[0x19] = &PTR_destroy_0070dd50;
          ((Exception *)((long)auVar3 + -400))->trace[0x1d] = local_1a0;
          ((Exception *)((long)auVar3 + -400))->trace[0x1e] = (void *)minBytes;
          ((Exception *)((long)auVar3 + -400))->trace[0x1f] = local_120;
          *(OwnFd **)&((Exception *)((long)auVar3 + -400))->traceCount = fdBuffer;
          (((Exception *)((long)auVar3 + -400))->details).builder.ptr = local_190;
          (((Exception *)((long)auVar3 + -400))->details).builder.pos = local_160;
          (((Exception *)((long)auVar3 + -400))->details).builder.endPtr =
               (Detail *)alreadyRead.capCount;
          (((Exception *)((long)auVar3 + -400))->details).builder.disposer = in_stack_00000018;
          ((Exception *)((long)auVar3 + -400))->trace[0x1a] = pPVar1;
        }
        local_b8[0].fileName =
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
        ;
        local_b8[0].function = "then";
        local_b8[0].lineNumber = 0x58b;
        local_b8[0].columnNumber = 0x4c;
        local_158.builder.ptr = (AncillaryMessage *)this_00;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_108,(OwnPromiseNode *)&local_158,local_b8);
        pAVar6 = local_158.builder.ptr;
        PVar2.node.ptr = local_198.node.ptr;
        *(void **)local_198.node.ptr = local_108.msg_name;
        if ((TransformPromiseNodeBase *)local_158.builder.ptr != (TransformPromiseNodeBase *)0x0) {
          local_158.builder.ptr = (AncillaryMessage *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pAVar6);
        }
        auVar3 = local_188;
        if (local_188 == (undefined1  [8])0x0) {
          return (Promise<kj::AsyncCapabilityStream::ReadResult>)(PromiseNode *)PVar2.node.ptr;
        }
        local_188 = (undefined1  [8])0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
        return (Promise<kj::AsyncCapabilityStream::ReadResult>)(PromiseNode *)PVar2.node.ptr;
      }
      if (pvVar11 != (void *)0x0) {
        if (pvVar11 <= local_120 && (long)local_120 - (long)pvVar11 != 0) {
          alreadyRead_00.capCount = alreadyRead.capCount + (long)pvVar11;
          alreadyRead_00.byteCount = (size_t)local_160;
          tryReadInternal((AsyncStreamFd *)local_198.node.ptr,buffer_00,minBytes + (long)pvVar11,
                          (long)local_120 - (long)pvVar11,(OwnFd *)((long)fdBuffer - (long)pvVar11),
                          (size_t)local_190,alreadyRead_00);
          return (Promise<kj::AsyncCapabilityStream::ReadResult>)(PromiseNode *)PVar2.node.ptr;
        }
        alreadyRead.capCount = (long)pvVar11 + alreadyRead.capCount;
      }
      local_b8[0].function = (char *)in_stack_00000018;
      local_b8[0].fileName = (char *)alreadyRead.capCount;
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult>,kj::_::PromiseDisposer,kj::AsyncCapabilityStream::ReadResult>
                ((PromiseDisposer *)&local_108,(ReadResult *)local_b8);
      goto LAB_004b45e3;
    }
  }
  else {
    local_108.msg_control = (void *)0x0;
    local_108.msg_controllen = 0;
    local_108.msg_name = (void *)0x0;
    local_108.msg_namelen = 0;
    local_108._12_4_ = 0;
    local_108.msg_flags = 0;
    local_108._52_4_ = 0;
    local_108.msg_iov = &local_c8;
    local_108.msg_iovlen = 1;
    pcVar18 = (char *)0x810;
    if (*(char *)((long)buffer + 0x90) == '\0') {
      pcVar18 = (char *)((alreadyRead.byteCount * 4 + 7 & 0xfffffffffffffff8) + 0x10);
    }
    local_c8.iov_base = (void *)minBytes;
    local_c8.iov_len = (size_t)fdBuffer;
    if (pcVar18 < (char *)0x88) {
      local_138 = (SourceLocation *)0x0;
      uStack_130 = 0;
      local_128 = (undefined8 *)0x0;
      pSVar13 = local_b8;
      pcVar12 = pcVar18;
    }
    else {
      uVar17 = (ulong)pcVar18 >> 3;
      pSVar13 = (SourceLocation *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (8,uVar17,uVar17,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_128 = &kj::_::HeapArrayDisposer::instance;
      pcVar12 = (char *)(uVar17 << 3);
      uStack_130 = uVar17;
      local_138 = pSVar13;
    }
    local_118 = (void *)minBytes;
    memset(pSVar13,0,(size_t)pcVar12);
    local_108.msg_control = pSVar13;
    local_108.msg_controllen = (size_t)pcVar18;
    do {
      pvVar11 = (void *)recvmsg(*(int *)((long)local_1a0 + 0x10),&local_108,0x40000000);
      if (-1 < (long)pvVar11) {
        iVar14 = 0;
        break;
      }
      uVar10 = kj::_::Debug::getOsErrorNumber(true);
      pSVar13 = (SourceLocation *)((ulong)pSVar13 & 0xffffffff);
      if (uVar10 != 0xffffffff) {
        pSVar13 = (SourceLocation *)(ulong)uVar10;
      }
      iVar14 = (int)pSVar13;
    } while (uVar10 == 0xffffffff);
    minBytes = (size_t)local_118;
    if (iVar14 == 0) {
      if ((long)pvVar11 < 0) {
        iVar14 = 0;
      }
      else {
        local_158.builder.ptr = (AncillaryMessage *)0x0;
        local_158.builder.pos = (AncillaryMessage *)0x0;
        local_158.builder.endPtr = (AncillaryMessage *)0x0;
        local_158.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
        uVar17 = 0;
        pSVar13 = (SourceLocation *)local_108.msg_control;
        pcVar18 = (char *)local_108.msg_controllen;
        local_d0 = fdBuffer;
        if ((SourceLocation *)local_108.msg_control != (SourceLocation *)0x0 &&
            (char *)0xf < local_108.msg_controllen) {
          do {
            if ((char *)0xf < pcVar18) {
              if ((*(int *)&pSVar13->function == 1) && (*(int *)((long)&pSVar13->function + 4) == 1)
                 ) {
                pcVar12 = pSVar13->fileName;
                if (pcVar18 <= pSVar13->fileName) {
                  pcVar12 = pcVar18;
                }
                local_188 = (undefined1  [8])0x0;
                pEStack_180 = (Exception *)0x0;
                local_178 = (Exception *)0x0;
                local_170 = (ArrayDisposer *)&NullArrayDisposer::instance;
                if ((char *)0x3 < pcVar12 + -0x10) {
                  uVar15 = 0;
                  do {
                    local_1a4.fd = *(int *)((long)&pSVar13->lineNumber + uVar15);
                    if (uVar17 < alreadyRead.byteCount) {
                      local_10c.fd = *(int *)((long)&local_190->id + uVar17 * 4);
                      *(int *)((long)&local_190->id + uVar17 * 4) = local_1a4.fd;
                      local_1a4.fd = -1;
                      OwnFd::~OwnFd(&local_10c);
                      uVar17 = uVar17 + 1;
                    }
                    else {
                      if (pEStack_180 == local_178) {
                        sVar16 = (long)local_178 - (long)local_188 >> 1;
                        if ((undefined1  [8])local_178 == local_188) {
                          sVar16 = 4;
                        }
                        Vector<kj::OwnFd>::setCapacity((Vector<kj::OwnFd> *)local_188,sVar16);
                      }
                      *(int *)&(pEStack_180->ownFile).content.ptr = local_1a4.fd;
                      local_1a4.fd = -1;
                      pEStack_180 = (Exception *)((long)&(pEStack_180->ownFile).content.ptr + 4);
                    }
                    OwnFd::~OwnFd(&local_1a4);
                    uVar15 = uVar15 + 4;
                  } while (((ulong)(pcVar12 + -0x10) & 0xfffffffffffffffc) != uVar15);
                }
                pEVar5 = local_178;
                pEVar4 = pEStack_180;
                auVar3 = local_188;
                minBytes = (size_t)local_118;
                if (local_188 != (undefined1  [8])0x0) {
                  local_188 = (undefined1  [8])0x0;
                  pEStack_180 = (Exception *)0x0;
                  local_178 = (Exception *)0x0;
                  (**local_170->_vptr_ArrayDisposer)
                            (local_170,auVar3,4,(long)pEVar4 - (long)auVar3 >> 2,
                             (long)pEVar5 - (long)auVar3 >> 2,
                             ArrayDisposer::Dispose_<kj::OwnFd>::destruct);
                  minBytes = (size_t)local_118;
                }
              }
              else if (((char *)0xf < pcVar18) && ((*(byte *)((long)local_1a0 + 0x90) & 1) != 0)) {
                pcVar12 = pSVar13->fileName;
                if (pcVar18 <= pSVar13->fileName) {
                  pcVar12 = pcVar18;
                }
                if (local_158.builder.pos == local_158.builder.endPtr) {
                  sVar16 = ((long)local_158.builder.endPtr - (long)local_158.builder.ptr >> 3) *
                           0x5555555555555556;
                  if (local_158.builder.endPtr == local_158.builder.ptr) {
                    sVar16 = 4;
                  }
                  Vector<kj::AncillaryMessage>::setCapacity(&local_158,sVar16);
                }
                *(char **)local_158.builder.pos = pSVar13->function;
                ((local_158.builder.pos)->data).ptr = (uchar *)&pSVar13->lineNumber;
                ((local_158.builder.pos)->data).size_ = (size_t)(pcVar12 + -0x10);
                local_158.builder.pos = local_158.builder.pos + 1;
                minBytes = (size_t)local_118;
              }
            }
            if (pcVar18 < (char *)0x10) {
              pcVar18 = (char *)0x0;
            }
            else {
              bVar19 = pcVar18 < pSVar13->fileName;
              pcVar18 = pcVar18 + -(long)pSVar13->fileName;
              if (bVar19) {
                pcVar18 = (char *)0x0;
              }
            }
            pSVar13 = (SourceLocation *)__cmsg_nxthdr(&local_108,(cmsghdr *)pSVar13);
          } while (pSVar13 != (SourceLocation *)0x0);
        }
        if (((long)local_158.builder.pos - (long)local_158.builder.ptr != 0) &&
           (*(char *)((long)local_1a0 + 0x90) == '\x01')) {
          (**(code **)**(undefined8 **)((long)local_1a0 + 0xa0))
                    (*(undefined8 **)((long)local_1a0 + 0xa0),local_158.builder.ptr,
                     ((long)local_158.builder.pos - (long)local_158.builder.ptr >> 3) *
                     -0x5555555555555555);
        }
        pAVar8 = local_158.builder.endPtr;
        pRVar7 = local_158.builder.pos;
        pAVar6 = local_158.builder.ptr;
        in_stack_00000018 =
             (ArrayDisposer *)((long)&in_stack_00000018->_vptr_ArrayDisposer + uVar17);
        if (local_158.builder.ptr != (AncillaryMessage *)0x0) {
          local_158.builder.ptr = (AncillaryMessage *)0x0;
          local_158.builder.pos = (AncillaryMessage *)0x0;
          local_158.builder.endPtr = (AncillaryMessage *)0x0;
          (**(local_158.builder.disposer)->_vptr_ArrayDisposer)
                    (local_158.builder.disposer,pAVar6,0x18,
                     ((long)pRVar7 - (long)pAVar6 >> 3) * -0x5555555555555555,
                     ((long)pAVar8 - (long)pAVar6 >> 3) * -0x5555555555555555,0);
        }
        local_160 = (RemoveConst<kj::Exception::Detail> *)((long)local_160 - uVar17);
        local_190 = (Detail *)((long)&local_190->id + uVar17 * 4);
        iVar14 = 0;
        fdBuffer = local_d0;
      }
    }
    else {
      local_188 = (undefined1  [8])0x0;
      local_158.builder.ptr = (AncillaryMessage *)0x0;
      local_158.builder.pos = (AncillaryMessage *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)local_188,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::~Fault((Fault *)local_188);
      iVar14 = 5;
    }
    uVar17 = uStack_130;
    pSVar13 = local_138;
    buffer_00 = local_1a0;
    if (local_138 != (SourceLocation *)0x0) {
      local_138 = (SourceLocation *)0x0;
      uStack_130 = 0;
      (**(code **)*local_128)(local_128,pSVar13,8,uVar17,uVar17,0);
    }
    if (iVar14 == 0) goto LAB_004b447b;
  }
  PVar2.node.ptr = local_198.node.ptr;
  if (iVar14 != 5) {
    return (Promise<kj::AsyncCapabilityStream::ReadResult>)(PromiseNode *)local_198.node.ptr;
  }
  local_b8[0].fileName = (char *)alreadyRead.capCount;
  local_b8[0].function = (char *)in_stack_00000018;
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult>,kj::_::PromiseDisposer,kj::AsyncCapabilityStream::ReadResult>
            ((PromiseDisposer *)&local_108,(ReadResult *)local_b8);
  local_198.node.ptr = PVar2.node.ptr;
LAB_004b45e3:
  *(void **)local_198.node.ptr = local_108.msg_name;
  return (Promise<kj::AsyncCapabilityStream::ReadResult>)(PromiseNode *)local_198.node.ptr;
}

Assistant:

Promise<ReadResult> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                      OwnFd* fdBuffer, size_t maxFds,
                                      ReadResult alreadyRead) {
    // `alreadyRead` is the number of bytes we have already received via previous reads -- minBytes,
    // maxBytes, and buffer have already been adjusted to account for them, but this count must
    // be included in the final return value.

    ssize_t n;
    if (maxFds == 0 && ancillaryMsgCallback == kj::none) {
      KJ_NONBLOCKING_SYSCALL(n = ::read(fd, buffer, maxBytes)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    } else {
      struct msghdr msg;
      memset(&msg, 0, sizeof(msg));

      struct iovec iov;
      memset(&iov, 0, sizeof(iov));
      iov.iov_base = buffer;
      iov.iov_len = maxBytes;
      msg.msg_iov = &iov;
      msg.msg_iovlen = 1;

      // Allocate space to receive a cmsg.
      size_t msgBytes;
      if (ancillaryMsgCallback == kj::none) {
#if __APPLE__ || __FreeBSD__
        // Until very recently (late 2018 / early 2019), FreeBSD suffered from a bug in which when
        // an SCM_RIGHTS message was truncated on delivery, it would not close the FDs that weren't
        // delivered -- they would simply leak: https://bugs.freebsd.org/131876
        //
        // My testing indicates that MacOS has this same bug as of today (April 2019). I don't know
        // if they plan to fix it or are even aware of it.
        //
        // To handle both cases, we will always provide space to receive 512 FDs. Hopefully, this is
        // greater than the maximum number of FDs that these kernels will transmit in one message
        // PLUS enough space for any other ancillary messages that could be sent before the
        // SCM_RIGHTS message to push it back in the buffer. I couldn't find any firm documentation
        // on these limits, though -- I only know that Linux is limited to 253, and I saw a hint in
        // a comment in someone else's application that suggested FreeBSD is the same. Hopefully,
        // then, this is sufficient to prevent attacks. But if not, there's nothing more we can do;
        // it's really up to the kernel to fix this.
        msgBytes = CMSG_SPACE(sizeof(int) * 512);
#else
        msgBytes = CMSG_SPACE(sizeof(int) * maxFds);
#endif
      } else {
        // If we want room for ancillary messages instead of or in addition to FDs, just use the
        // same amount of cushion as in the MacOS/FreeBSD case above.
        // Someday we may want to allow customization here, but there's no immediate use for it.
        msgBytes = CMSG_SPACE(sizeof(int) * 512);
      }

      // On Linux, CMSG_SPACE will align to a word-size boundary, but on Mac it always aligns to a
      // 32-bit boundary. I guess aligning to 32 bits helps avoid the problem where you
      // surprisingly end up with space for two file descriptors when you only wanted one. However,
      // cmsghdr's preferred alignment is word-size (it contains a size_t). If we stack-allocate
      // the buffer, we need to make sure it is aligned properly (maybe not on x64, but maybe on
      // other platforms), so we want to allocate an array of words (we use void*). So... we use
      // CMSG_SPACE() and then additionally round up to deal with Mac.
      size_t msgWords = (msgBytes + sizeof(void*) - 1) / sizeof(void*);
      KJ_STACK_ARRAY(void*, cmsgSpace, msgWords, 16, 256);
      auto cmsgBytes = cmsgSpace.asBytes();
      memset(cmsgBytes.begin(), 0, cmsgBytes.size());
      msg.msg_control = cmsgBytes.begin();
      msg.msg_controllen = msgBytes;

#ifdef MSG_CMSG_CLOEXEC
      static constexpr int RECVMSG_FLAGS = MSG_CMSG_CLOEXEC;
#else
      static constexpr int RECVMSG_FLAGS = 0;
#endif

      KJ_NONBLOCKING_SYSCALL(n = ::recvmsg(fd, &msg, RECVMSG_FLAGS)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }

      if (n >= 0) {
        // Process all messages.
        //
        // WARNING DANGER: We have to be VERY careful not to miss a file descriptor here, because
        // if we do, then that FD will never be closed, and a malicious peer could exploit this to
        // fill up our FD table, creating a DoS attack. Some things to keep in mind:
        // - CMSG_SPACE() could have rounded up the space for alignment purposes, and this could
        //   mean we permitted the kernel to deliver more file descriptors than `maxFds`. We need
        //   to close the extras.
        // - We can receive multiple ancillary messages at once. In particular, there is also
        //   SCM_CREDENTIALS. The sender decides what to send. They could send SCM_CREDENTIALS
        //   first followed by SCM_RIGHTS. We need to make sure we see both.
        size_t nfds = 0;
        size_t spaceLeft = msg.msg_controllen;
        Vector<AncillaryMessage> ancillaryMessages;
        for (struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg);
            cmsg != nullptr; cmsg = CMSG_NXTHDR(&msg, cmsg)) {
          if (spaceLeft >= CMSG_LEN(0) &&
              cmsg->cmsg_level == SOL_SOCKET && cmsg->cmsg_type == SCM_RIGHTS) {
            // Some operating systems (like MacOS) do not adjust csmg_len when the message is
            // truncated. We must do so ourselves or risk overrunning the buffer.
            auto len = kj::min(cmsg->cmsg_len, spaceLeft);
            auto data = arrayPtr(reinterpret_cast<int*>(CMSG_DATA(cmsg)),
                                 (len - CMSG_LEN(0)) / sizeof(int));
            kj::Vector<kj::OwnFd> trashFds;
            for (auto fd: data) {
              kj::OwnFd ownFd(fd);
              if (nfds < maxFds) {
                fdBuffer[nfds++] = kj::mv(ownFd);
              } else {
                trashFds.add(kj::mv(ownFd));
              }
            }
          } else if (spaceLeft >= CMSG_LEN(0) && ancillaryMsgCallback != kj::none) {
            auto len = kj::min(cmsg->cmsg_len, spaceLeft);
            auto data = ArrayPtr<const byte>(CMSG_DATA(cmsg), len - CMSG_LEN(0));
            ancillaryMessages.add(cmsg->cmsg_level, cmsg->cmsg_type, data);
          }

          if (spaceLeft >= CMSG_LEN(0) && spaceLeft >= cmsg->cmsg_len) {
            spaceLeft -= cmsg->cmsg_len;
          } else {
            spaceLeft = 0;
          }
        }

#ifndef MSG_CMSG_CLOEXEC
        for (size_t i = 0; i < nfds; i++) {
          setCloseOnExec(fdBuffer[i]);
        }
#endif

        if (ancillaryMessages.size() > 0) {
          KJ_IF_SOME(fn, ancillaryMsgCallback) {
            fn(ancillaryMessages.asPtr());
          }
        }

        alreadyRead.capCount += nfds;
        fdBuffer += nfds;
        maxFds -= nfds;
      }
    }

    if (false) {
    error:
      return alreadyRead;
    }

    if (n < 0) {
      // Read would block.
      return observer.whenBecomesReadable().then(
          [this, buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead]() {
              return tryReadInternal(buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead);
      });
    } else if (n == 0) {
      // EOF -OR- maxBytes == 0.
      return alreadyRead;
    } else if (implicitCast<size_t>(n) >= minBytes) {
      // We read enough to stop here.
      alreadyRead.byteCount += n;
      return alreadyRead;
    } else {
      // The kernel returned fewer bytes than we asked for (and fewer than we need).

      buffer = reinterpret_cast<byte*>(buffer) + n;
      minBytes -= n;
      maxBytes -= n;
      alreadyRead.byteCount += n;

      // According to David Klempner, who works on Stubby at Google, we sadly CANNOT assume that
      // we've consumed the whole read buffer here. If a signal is delivered in the middle of a
      // read() -- yes, even a non-blocking read -- it can cause the kernel to return a partial
      // result, with data still in the buffer.
      //     https://bugzilla.kernel.org/show_bug.cgi?id=199131
      //     https://twitter.com/CaptainSegfault/status/1112622245531144194
      //
      // Unfortunately, we have no choice but to issue more read()s until it either tells us EOF
      // or EAGAIN. We used to have an optimization here using observer.atEndHint() (when it is
      // non-null) to avoid a redundant call to read(). Alas...
      return tryReadInternal(buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead);
    }
  }